

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O0

double __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::ted_k
          (LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          TreeIndexLGM *t1,TreeIndexLGM *t2,int k)

{
  TreeIndexLGM *t2_00;
  TreeIndexLGM *t1_00;
  int iVar1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  int local_2c;
  TreeIndexLGM *pTStack_28;
  int k_local;
  TreeIndexLGM *t2_local;
  TreeIndexLGM *t1_local;
  LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this_local;
  
  local_2c = k;
  pTStack_28 = t2;
  t2_local = t1;
  t1_local = (TreeIndexLGM *)this;
  init(this,(EVP_PKEY_CTX *)t2);
  t1_00 = t2_local;
  t2_00 = pTStack_28;
  iVar1 = (t2_local->super_Constants).tree_size_ - (pTStack_28->super_Constants).tree_size_;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (local_2c < iVar1) {
    this_local = (LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>
                  *)std::numeric_limits<double>::infinity();
  }
  else {
    lb_mapping_fill_gaps(&local_48,this,t2_local,pTStack_28,local_2c);
    this_local = (LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>
                  *)mapping_cost(this,t1_00,t2_00,&local_48);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_48);
  }
  return (double)this_local;
}

Assistant:

double LGMTreeIndex<CostModel, TreeIndex>::ted_k(const TreeIndex& t1,
    const TreeIndex& t2, const int k) {
  // Initialize the internals.
  init(t2);

  // We don't compute the upper bound for node pairs with size lower bound
  // greater than threshold.
  if (std::abs(t1.tree_size_ - t2.tree_size_) > k) {
    return std::numeric_limits<double>::infinity();
  }
  return mapping_cost(t1, t2, lb_mapping_fill_gaps(t1, t2, k));
}